

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCPackIFWPackage.cxx
# Opt level: O0

int __thiscall
cmCPackIFWPackage::ConfigureFromGroup(cmCPackIFWPackage *this,cmCPackComponentGroup *group)

{
  cmCPackLog *this_00;
  char *pcVar1;
  size_type sVar2;
  ostream *poVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_320;
  char *local_300;
  char *option_2;
  undefined1 local_2d8 [8];
  ostringstream cmCPackLog_msg;
  allocator local_159;
  string local_158;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_138;
  char *local_118;
  char *option_1;
  char *local_f0;
  char *option;
  string local_e0;
  char *local_c0;
  char *optPACKAGE_VERSION;
  char *local_98;
  char *optVERSION;
  string local_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  undefined1 local_40 [8];
  string prefix;
  cmCPackComponentGroup *group_local;
  cmCPackIFWPackage *this_local;
  
  if (group == (cmCPackComponentGroup *)0x0) {
    this_local._4_4_ = 0;
  }
  else {
    prefix.field_2._8_8_ = group;
    DefaultConfiguration(this);
    cmsys::SystemTools::UpperCase(&local_80,(string *)prefix.field_2._8_8_);
    std::operator+(&local_60,"CPACK_IFW_COMPONENT_GROUP_",&local_80);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_40,
                   &local_60,"_");
    std::__cxx11::string::~string((string *)&local_60);
    std::__cxx11::string::~string((string *)&local_80);
    std::__cxx11::string::operator=((string *)this,(string *)(prefix.field_2._8_8_ + 0x20));
    std::__cxx11::string::operator=
              ((string *)&this->Description,(string *)(prefix.field_2._8_8_ + 0x40));
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &optPACKAGE_VERSION,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_40,
                   "VERSION");
    pcVar1 = GetOption(this,(string *)&optPACKAGE_VERSION);
    std::__cxx11::string::~string((string *)&optPACKAGE_VERSION);
    local_98 = pcVar1;
    if (pcVar1 == (char *)0x0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)&local_e0,"CPACK_PACKAGE_VERSION",(allocator *)((long)&option + 7));
      pcVar1 = GetOption(this,&local_e0);
      std::__cxx11::string::~string((string *)&local_e0);
      std::allocator<char>::~allocator((allocator<char> *)((long)&option + 7));
      local_c0 = pcVar1;
      if (pcVar1 == (char *)0x0) {
        std::__cxx11::string::operator=((string *)&this->Version,"1.0.0");
      }
      else {
        std::__cxx11::string::operator=((string *)&this->Version,pcVar1);
      }
    }
    else {
      std::__cxx11::string::operator=((string *)&this->Version,pcVar1);
    }
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&option_1,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_40,
                   "SCRIPT");
    pcVar1 = GetOption(this,(string *)&option_1);
    std::__cxx11::string::~string((string *)&option_1);
    local_f0 = pcVar1;
    if (pcVar1 != (char *)0x0) {
      std::__cxx11::string::operator=((string *)&this->Script,pcVar1);
    }
    std::operator+(&local_138,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_40,
                   "LICENSES");
    pcVar1 = GetOption(this,&local_138);
    std::__cxx11::string::~string((string *)&local_138);
    local_118 = pcVar1;
    if (pcVar1 != (char *)0x0) {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::clear(&this->Licenses);
      pcVar1 = local_118;
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_158,pcVar1,&local_159);
      cmSystemTools::ExpandListArgument(&local_158,&this->Licenses,false);
      std::__cxx11::string::~string((string *)&local_158);
      std::allocator<char>::~allocator((allocator<char> *)&local_159);
      sVar2 = std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::size(&this->Licenses);
      if ((sVar2 & 1) != 0) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_2d8);
        poVar3 = std::operator<<((ostream *)local_2d8,(string *)local_40);
        poVar3 = std::operator<<(poVar3,"LICENSES");
        poVar3 = std::operator<<(poVar3," should contain pairs of <display_name> and <file_path>.");
        std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
        if (this->Generator != (cmCPackIFWGenerator *)0x0) {
          this_00 = (this->Generator->super_cmCPackGenerator).Logger;
          std::__cxx11::ostringstream::str();
          pcVar1 = (char *)std::__cxx11::string::c_str();
          cmCPackLog::Log(this_00,8,
                          "/workspace/llm4binary/github/license_all_cmakelists_25/ewmailing[P]CMake/Source/CPack/IFW/cmCPackIFWPackage.cxx"
                          ,0x179,pcVar1);
          std::__cxx11::string::~string((string *)&option_2);
        }
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_2d8);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::clear(&this->Licenses);
      }
    }
    std::operator+(&local_320,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_40,
                   "PRIORITY");
    pcVar1 = GetOption(this,&local_320);
    std::__cxx11::string::~string((string *)&local_320);
    local_300 = pcVar1;
    if (pcVar1 != (char *)0x0) {
      std::__cxx11::string::operator=((string *)&this->SortingPriority,pcVar1);
    }
    this_local._4_4_ = 1;
    std::__cxx11::string::~string((string *)local_40);
  }
  return this_local._4_4_;
}

Assistant:

int
cmCPackIFWPackage::ConfigureFromGroup(cmCPackComponentGroup *group)
{
  if(!group) return 0;

  // Restore defaul configuration
  DefaultConfiguration();

  std::string prefix = "CPACK_IFW_COMPONENT_GROUP_"
    + cmsys::SystemTools::UpperCase(group->Name)
    + "_";

  DisplayName = group->DisplayName;
  Description = group->Description;

  // Version
  if(const char* optVERSION = GetOption(prefix + "VERSION"))
    {
    Version = optVERSION;
    }
  else if(const char* optPACKAGE_VERSION =
          GetOption("CPACK_PACKAGE_VERSION"))
    {
    Version = optPACKAGE_VERSION;
    }
  else
    {
    Version = "1.0.0";
    }

  // Script
  if (const char* option = GetOption(prefix + "SCRIPT"))
    {
    Script = option;
    }

  // Licenses
  if (const char* option = this->GetOption(prefix + "LICENSES"))
    {
    Licenses.clear();
    cmSystemTools::ExpandListArgument( option, Licenses );
    if ( Licenses.size() % 2 != 0 )
      {
      cmCPackLogger(cmCPackLog::LOG_WARNING, prefix << "LICENSES"
        << " should contain pairs of <display_name> and <file_path>."
        << std::endl);
      Licenses.clear();
      }
    }

  // Priority
  if(const char* option = this->GetOption(prefix + "PRIORITY"))
    {
    SortingPriority = option;
    }

  return 1;
}